

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

int64_t spvtools::opt::anon_unknown_15::GreatestCommonDivisor(int64_t a,int64_t b)

{
  int64_t iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
LAB_00279878:
  do {
    uVar3 = a;
    lVar4 = (long)uVar3 % 2;
    do {
      uVar2 = b;
      if (uVar3 == uVar2) {
        return uVar3;
      }
      if (uVar3 == 0) {
        return uVar2;
      }
      if (uVar2 == 0) {
        return uVar3;
      }
      if ((uVar2 & 1) == 0 && lVar4 == 0) {
        iVar1 = GreatestCommonDivisor((long)uVar3 / 2,(long)uVar2 >> 1);
        return iVar1 * 2;
      }
      b = uVar2;
      a = (long)uVar3 / 2;
      if ((uVar2 & 0x8000000000000001) == 1 && lVar4 == 0) goto LAB_00279878;
    } while ((lVar4 == 1) && (b = (long)uVar2 >> 1, (uVar2 & 1) == 0));
    if (uVar3 - uVar2 == 0 || (long)uVar3 < (long)uVar2) {
      b = uVar3;
      a = (long)(uVar2 - uVar3) / 2;
    }
    else {
      b = uVar2;
      a = (long)(uVar3 - uVar2) / 2;
    }
  } while( true );
}

Assistant:

int64_t GreatestCommonDivisor(int64_t a, int64_t b) {
  // Simple cases
  if (a == b) {
    return a;
  } else if (a == 0) {
    return b;
  } else if (b == 0) {
    return a;
  }

  // Both even
  if (a % 2 == 0 && b % 2 == 0) {
    return 2 * GreatestCommonDivisor(a / 2, b / 2);
  }

  // Even a, odd b
  if (a % 2 == 0 && b % 2 == 1) {
    return GreatestCommonDivisor(a / 2, b);
  }

  // Odd a, even b
  if (a % 2 == 1 && b % 2 == 0) {
    return GreatestCommonDivisor(a, b / 2);
  }

  // Both odd, reduce the larger argument
  if (a > b) {
    return GreatestCommonDivisor((a - b) / 2, b);
  } else {
    return GreatestCommonDivisor((b - a) / 2, a);
  }
}